

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O1

void chunk(LexState *ls)

{
  Token *pTVar1;
  Token *pTVar2;
  SemInfo *seminfo;
  int *l1;
  unsigned_short *puVar3;
  FuncState *pFVar4;
  Instruction *pIVar5;
  SemInfo SVar6;
  undefined4 uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  TString *pTVar13;
  TString *pTVar14;
  byte bVar15;
  uint uVar16;
  uint uVar17;
  FuncState *pFVar18;
  expdesc v;
  expdesc b;
  undefined1 local_80 [8];
  expdesc local_78;
  int local_5c;
  expdesc local_58;
  FuncState *local_40;
  FuncState *local_38;
  
  uVar16 = *(int *)&ls->L->nCcalls + 1;
  ls->L->nCcalls = (unsigned_short)uVar16;
  if (200 < (uVar16 & 0xffff)) {
    luaX_lexerror(ls,"chunk has too many syntax levels",0);
  }
  pTVar1 = &ls->t;
  pTVar2 = &ls->lookahead;
  seminfo = &(ls->t).seminfo;
  do {
    iVar8 = pTVar1->token;
    if ((iVar8 - 0x104U < 0x1c) && ((0x8010007U >> (iVar8 - 0x104U & 0x1f) & 1) != 0))
    goto LAB_0010b853;
    if (iVar8 - 0x102U < 0x14) {
      iVar10 = ls->linenumber;
      switch(iVar8) {
      case 0x102:
        ls->lastline = iVar10;
        if ((ls->lookahead).token == 0x11f) {
          iVar8 = llex(ls,seminfo);
          (ls->t).token = iVar8;
        }
        else {
          uVar7 = *(undefined4 *)&pTVar2->field_0x4;
          SVar6 = (ls->lookahead).seminfo;
          pTVar1->token = pTVar2->token;
          *(undefined4 *)&pTVar1->field_0x4 = uVar7;
          (ls->t).seminfo = SVar6;
          pTVar2->token = 0x11f;
        }
        breakstat(ls);
LAB_0010b83b:
        testnext(ls,0x3b);
        ls->fs->freereg = (uint)ls->fs->nactvar;
LAB_0010b853:
        puVar3 = &ls->L->nCcalls;
        *puVar3 = *puVar3 - 1;
        return;
      case 0x103:
        ls->lastline = iVar10;
        if ((ls->lookahead).token == 0x11f) {
          iVar8 = llex(ls,seminfo);
          (ls->t).token = iVar8;
        }
        else {
          uVar7 = *(undefined4 *)&pTVar2->field_0x4;
          SVar6 = (ls->lookahead).seminfo;
          pTVar1->token = pTVar2->token;
          *(undefined4 *)&pTVar1->field_0x4 = uVar7;
          (ls->t).seminfo = SVar6;
          pTVar2->token = 0x11f;
        }
        block(ls);
        check_match(ls,0x106,0x103,iVar10);
        break;
      default:
        goto switchD_0010ad5c_caseD_104;
      case 0x108:
        local_40 = ls->fs;
        local_58.u.s.info = -1;
        local_58.u.s.aux._0_1_ = local_40->nactvar;
        local_58.u.s.aux._1_2_ = 0x100;
        local_58._0_8_ = local_40->bl;
        local_40->bl = (BlockCnt *)&local_58;
        ls->lastline = iVar10;
        if ((ls->lookahead).token == 0x11f) {
          iVar8 = llex(ls,seminfo);
          (ls->t).token = iVar8;
        }
        else {
          uVar7 = *(undefined4 *)&pTVar2->field_0x4;
          SVar6 = (ls->lookahead).seminfo;
          pTVar1->token = pTVar2->token;
          *(undefined4 *)&pTVar1->field_0x4 = uVar7;
          (ls->t).seminfo = SVar6;
          pTVar2->token = 0x11f;
        }
        pTVar13 = str_checkname(ls);
        iVar8 = (ls->t).token;
        if ((iVar8 == 0x2c) || (iVar8 == 0x10b)) {
          local_38 = ls->fs;
          local_5c = local_38->freereg;
          pTVar14 = luaX_newstring(ls,"(for generator)",0xf);
          new_localvar(ls,pTVar14,0);
          pTVar14 = luaX_newstring(ls,"(for state)",0xb);
          iVar11 = 1;
          new_localvar(ls,pTVar14,1);
          pTVar14 = luaX_newstring(ls,"(for control)",0xd);
          new_localvar(ls,pTVar14,2);
          new_localvar(ls,pTVar13,3);
          iVar8 = testnext(ls,0x2c);
          if (iVar8 != 0) {
            iVar8 = 4;
            do {
              iVar11 = iVar8;
              pTVar13 = str_checkname(ls);
              new_localvar(ls,pTVar13,iVar11);
              iVar9 = testnext(ls,0x2c);
              iVar8 = iVar11 + 1;
            } while (iVar9 != 0);
            iVar11 = iVar11 + -2;
          }
          checknext(ls,0x10b);
          iVar8 = ls->linenumber;
          iVar9 = explist1(ls,(expdesc *)local_80);
          adjust_assign(ls,3,iVar9,(expdesc *)local_80);
          luaK_checkstack(local_38,3);
          forbody(ls,local_5c,iVar8,iVar11,0);
        }
        else {
          if (iVar8 != 0x3d) {
            luaX_lexerror(ls,"\'=\' or \'in\' expected",iVar8);
          }
          pFVar4 = ls->fs;
          local_5c = pFVar4->freereg;
          pTVar14 = luaX_newstring(ls,"(for index)",0xb);
          new_localvar(ls,pTVar14,0);
          pTVar14 = luaX_newstring(ls,"(for limit)",0xb);
          new_localvar(ls,pTVar14,1);
          pTVar14 = luaX_newstring(ls,"(for step)",10);
          new_localvar(ls,pTVar14,2);
          new_localvar(ls,pTVar13,3);
          checknext(ls,0x3d);
          subexpr(ls,(expdesc *)local_80,0);
          luaK_exp2nextreg(ls->fs,(expdesc *)local_80);
          checknext(ls,0x2c);
          subexpr(ls,(expdesc *)local_80,0);
          luaK_exp2nextreg(ls->fs,(expdesc *)local_80);
          iVar8 = testnext(ls,0x2c);
          if (iVar8 == 0) {
            iVar8 = pFVar4->freereg;
            local_80 = (undefined1  [8])0x3ff0000000000000;
            local_78.k = VFALSE;
            iVar11 = addk(pFVar4,(TValue *)local_80,(TValue *)local_80);
            luaK_code(pFVar4,(iVar8 << 6 | iVar11 << 0xe) + 1,pFVar4->ls->lastline);
            luaK_checkstack(pFVar4,1);
            pFVar4->freereg = pFVar4->freereg + 1;
          }
          else {
            subexpr(ls,(expdesc *)local_80,0);
            luaK_exp2nextreg(ls->fs,(expdesc *)local_80);
          }
          forbody(ls,local_5c,iVar10,1,1);
        }
        check_match(ls,0x106,0x108,iVar10);
        leaveblock(local_40);
        break;
      case 0x109:
        ls->lastline = iVar10;
        if ((ls->lookahead).token == 0x11f) {
          iVar8 = llex(ls,seminfo);
          (ls->t).token = iVar8;
        }
        else {
          uVar7 = *(undefined4 *)&pTVar2->field_0x4;
          SVar6 = (ls->lookahead).seminfo;
          pTVar1->token = pTVar2->token;
          *(undefined4 *)&pTVar1->field_0x4 = uVar7;
          (ls->t).seminfo = SVar6;
          pTVar2->token = 0x11f;
        }
        singlevar(ls,(expdesc *)local_80);
        while (iVar8 = pTVar1->token, iVar8 == 0x2e) {
          field(ls,(expdesc *)local_80);
        }
        if (iVar8 == 0x3a) {
          field(ls,(expdesc *)local_80);
        }
        body(ls,&local_58,(uint)(iVar8 == 0x3a),iVar10);
        luaK_storevar(ls->fs,(expdesc *)local_80,&local_58);
        ls->fs->f->lineinfo[(long)ls->fs->pc + -1] = iVar10;
        break;
      case 0x10a:
        pFVar4 = ls->fs;
        local_80._0_4_ = 0xffffffff;
        iVar8 = test_then_block(ls);
        l1 = &pFVar4->jpc;
        while (pTVar1->token == 0x105) {
          iVar11 = luaK_jump(pFVar4);
          luaK_concat(pFVar4,(int *)local_80,iVar11);
          pFVar4->lasttarget = pFVar4->pc;
          luaK_concat(pFVar4,l1,iVar8);
          iVar8 = test_then_block(ls);
        }
        if (pTVar1->token == 0x104) {
          iVar11 = luaK_jump(pFVar4);
          luaK_concat(pFVar4,(int *)local_80,iVar11);
          pFVar4->lasttarget = pFVar4->pc;
          luaK_concat(pFVar4,l1,iVar8);
          iVar8 = (ls->lookahead).token;
          ls->lastline = ls->linenumber;
          if (iVar8 == 0x11f) {
            iVar8 = llex(ls,seminfo);
            (ls->t).token = iVar8;
          }
          else {
            uVar7 = *(undefined4 *)&pTVar2->field_0x4;
            SVar6 = (ls->lookahead).seminfo;
            pTVar1->token = pTVar2->token;
            *(undefined4 *)&pTVar1->field_0x4 = uVar7;
            (ls->t).seminfo = SVar6;
            pTVar2->token = 0x11f;
          }
          block(ls);
        }
        else {
          luaK_concat(pFVar4,(int *)local_80,iVar8);
        }
        pFVar4->lasttarget = pFVar4->pc;
        luaK_concat(pFVar4,l1,local_80._0_4_);
        check_match(ls,0x106,0x10a,iVar10);
        break;
      case 0x10c:
        ls->lastline = iVar10;
        if ((ls->lookahead).token == 0x11f) {
          iVar8 = llex(ls,seminfo);
          (ls->t).token = iVar8;
        }
        else {
          uVar7 = *(undefined4 *)&pTVar2->field_0x4;
          SVar6 = (ls->lookahead).seminfo;
          pTVar1->token = pTVar2->token;
          *(undefined4 *)&pTVar1->field_0x4 = uVar7;
          (ls->t).seminfo = SVar6;
          pTVar2->token = 0x11f;
        }
        iVar8 = testnext(ls,0x109);
        if (iVar8 == 0) {
          iVar8 = 0;
          do {
            pTVar13 = str_checkname(ls);
            iVar11 = iVar8 + 1;
            new_localvar(ls,pTVar13,iVar8);
            iVar10 = testnext(ls,0x2c);
            iVar8 = iVar11;
          } while (iVar10 != 0);
          iVar8 = testnext(ls,0x3d);
          if (iVar8 == 0) {
            local_80 = (undefined1  [8])((ulong)local_80 & 0xffffffff00000000);
            iVar8 = 0;
          }
          else {
            iVar8 = explist1(ls,(expdesc *)local_80);
          }
          adjust_assign(ls,iVar11,iVar8,(expdesc *)local_80);
          adjustlocalvars(ls,iVar11);
        }
        else {
          pFVar4 = ls->fs;
          pTVar13 = str_checkname(ls);
          new_localvar(ls,pTVar13,0);
          local_78.k = pFVar4->freereg;
          local_78.u.nval = -NAN;
          local_80._0_4_ = 6;
          luaK_checkstack(pFVar4,1);
          pFVar4->freereg = pFVar4->freereg + 1;
          pFVar18 = ls->fs;
          bVar15 = pFVar18->nactvar + 1;
          pFVar18->nactvar = bVar15;
          pFVar18->f->locvars[*(ushort *)&pFVar18->upvalues[(ulong)bVar15 + 0x3b].info].startpc =
               pFVar18->pc;
          body(ls,&local_58,0,ls->linenumber);
          luaK_storevar(pFVar4,(expdesc *)local_80,&local_58);
          pFVar4->f->locvars[*(ushort *)&pFVar4->upvalues[(ulong)pFVar4->nactvar + 0x3b].info].
          startpc = pFVar4->pc;
        }
        break;
      case 0x110:
        pFVar4 = ls->fs;
        iVar8 = pFVar4->pc;
        pFVar4->lasttarget = iVar8;
        local_78.k = ~VVOID;
        local_78._6_1_ = 1;
        local_78._4_1_ = pFVar4->nactvar;
        local_78._5_1_ = 0;
        local_80 = (undefined1  [8])pFVar4->bl;
        pFVar4->bl = (BlockCnt *)local_80;
        local_58.u.s.info = -1;
        local_58.u.s.aux._1_2_ = 0;
        pFVar4->bl = (BlockCnt *)&local_58;
        ls->lastline = iVar10;
        local_58._0_8_ = (LHS_assign *)local_80;
        local_58.u.s.aux._0_1_ = local_78._4_1_;
        if ((ls->lookahead).token == 0x11f) {
          iVar11 = llex(ls,seminfo);
          (ls->t).token = iVar11;
        }
        else {
          uVar7 = *(undefined4 *)&pTVar2->field_0x4;
          SVar6 = (ls->lookahead).seminfo;
          pTVar1->token = pTVar2->token;
          *(undefined4 *)&pTVar1->field_0x4 = uVar7;
          (ls->t).seminfo = SVar6;
          pTVar2->token = 0x11f;
        }
        chunk(ls);
        check_match(ls,0x114,0x110,iVar10);
        iVar10 = cond(ls);
        if (local_58.u.s.aux._1_1_ == '\0') {
          leaveblock(pFVar4);
          pFVar18 = ls->fs;
        }
        else {
          breakstat(ls);
          pFVar18 = ls->fs;
          pFVar18->lasttarget = pFVar18->pc;
          luaK_concat(pFVar18,&pFVar18->jpc,iVar10);
          leaveblock(pFVar4);
          pFVar18 = ls->fs;
          iVar10 = luaK_jump(pFVar4);
        }
        luaK_patchlist(pFVar18,iVar10,iVar8);
        leaveblock(pFVar4);
        break;
      case 0x111:
        pFVar4 = ls->fs;
        ls->lastline = iVar10;
        if ((ls->lookahead).token == 0x11f) {
          iVar8 = llex(ls,seminfo);
          (ls->t).token = iVar8;
        }
        else {
          uVar7 = *(undefined4 *)&pTVar2->field_0x4;
          SVar6 = (ls->lookahead).seminfo;
          pTVar1->token = pTVar2->token;
          *(undefined4 *)&pTVar1->field_0x4 = uVar7;
          (ls->t).seminfo = SVar6;
          pTVar2->token = 0x11f;
        }
        uVar16 = pTVar1->token - 0x104;
        uVar17 = 0x80001e;
        uVar12 = 0;
        if ((pTVar1->token != 0x3b) &&
           (uVar12 = 0, (uVar16 < 0x1c & (byte)(0x8010007 >> ((byte)uVar16 & 0x1f))) == 0)) {
          iVar8 = explist1(ls,(expdesc *)local_80);
          if (local_80._0_4_ - VCALL < 2) {
            luaK_setreturns(pFVar4,(expdesc *)local_80,-1);
            if (iVar8 == 1 && local_80._0_4_ == VCALL) {
              pIVar5 = pFVar4->f->code;
              pIVar5[(int)local_78.k] = pIVar5[(int)local_78.k] & 0xffffffc0 | 0x1d;
            }
            uVar12 = (uint)pFVar4->nactvar;
            uVar17 = 0x1e;
          }
          else if (iVar8 == 1) {
            uVar12 = luaK_exp2anyreg(pFVar4,(expdesc *)local_80);
            uVar17 = 0x100001e;
          }
          else {
            luaK_exp2nextreg(pFVar4,(expdesc *)local_80);
            uVar12 = (uint)pFVar4->nactvar;
            uVar17 = iVar8 * 0x800000 + 0x80001e;
          }
        }
        luaK_code(pFVar4,uVar12 << 6 | uVar17,pFVar4->ls->lastline);
        goto LAB_0010b83b;
      case 0x115:
        pFVar4 = ls->fs;
        ls->lastline = iVar10;
        if ((ls->lookahead).token == 0x11f) {
          iVar8 = llex(ls,seminfo);
          (ls->t).token = iVar8;
        }
        else {
          uVar7 = *(undefined4 *)&pTVar2->field_0x4;
          SVar6 = (ls->lookahead).seminfo;
          pTVar1->token = pTVar2->token;
          *(undefined4 *)&pTVar1->field_0x4 = uVar7;
          (ls->t).seminfo = SVar6;
          pTVar2->token = 0x11f;
        }
        iVar8 = pFVar4->pc;
        pFVar4->lasttarget = iVar8;
        iVar11 = cond(ls);
        local_40 = (FuncState *)CONCAT44(local_40._4_4_,iVar11);
        local_78.k = ~VVOID;
        local_78._6_1_ = 1;
        local_78._4_1_ = pFVar4->nactvar;
        local_78._5_1_ = 0;
        local_80 = (undefined1  [8])pFVar4->bl;
        pFVar4->bl = (BlockCnt *)local_80;
        checknext(ls,0x103);
        block(ls);
        iVar11 = luaK_jump(pFVar4);
        luaK_patchlist(pFVar4,iVar11,iVar8);
        check_match(ls,0x106,0x115,iVar10);
        leaveblock(pFVar4);
        pFVar4->lasttarget = pFVar4->pc;
        luaK_concat(pFVar4,&pFVar4->jpc,(int)local_40);
      }
    }
    else {
switchD_0010ad5c_caseD_104:
      pFVar4 = ls->fs;
      primaryexp(ls,&local_78);
      if (local_78.k == VCALL) {
        pIVar5 = pFVar4->f->code;
        pIVar5[local_78.u.s.info] = pIVar5[local_78.u.s.info] & 0xff803fff | 0x4000;
      }
      else {
        local_80 = (undefined1  [8])0x0;
        assignment(ls,(LHS_assign *)local_80,1);
      }
    }
    testnext(ls,0x3b);
    ls->fs->freereg = (uint)ls->fs->nactvar;
  } while( true );
}

Assistant:

static void chunk(LexState*ls){
int islast=0;
enterlevel(ls);
while(!islast&&!block_follow(ls->t.token)){
islast=statement(ls);
testnext(ls,';');
ls->fs->freereg=ls->fs->nactvar;
}
leavelevel(ls);
}